

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::InsertAfterChild
          (TiXmlNode *this,TiXmlNode *afterThis,TiXmlNode *addThis)

{
  TiXmlNode *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TiXmlNode **ppTVar4;
  undefined4 extraout_var_03;
  TiXmlNode *node;
  TiXmlNode *pTVar3;
  
  if ((afterThis != (TiXmlNode *)0x0) && (afterThis->parent == this)) {
    pTVar3 = this;
    if (addThis->type == DOCUMENT) {
      while (iVar2 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar3),
            CONCAT44(extraout_var_00,iVar2) == 0) {
        ppTVar4 = &pTVar3->parent;
        pTVar3 = *ppTVar4;
        if (*ppTVar4 == (TiXmlNode *)0x0) {
          return (TiXmlNode *)0x0;
        }
      }
      iVar2 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar3);
      if (CONCAT44(extraout_var_01,iVar2) != 0) {
        while (iVar2 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this),
              CONCAT44(extraout_var_02,iVar2) == 0) {
          this = this->parent;
        }
        iVar2 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this);
        TiXmlDocument::SetError
                  ((TiXmlDocument *)CONCAT44(extraout_var_03,iVar2),0x10,(char *)0x0,
                   (TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        return (TiXmlNode *)0x0;
      }
    }
    else {
      iVar2 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(addThis);
      pTVar3 = (TiXmlNode *)CONCAT44(extraout_var,iVar2);
      if (pTVar3 != (TiXmlNode *)0x0) {
        pTVar3->parent = this;
        pTVar3->prev = afterThis;
        pTVar1 = afterThis->next;
        pTVar3->next = pTVar1;
        if (pTVar1 == (TiXmlNode *)0x0) {
          if (this->lastChild != afterThis) {
            __assert_fail("lastChild == afterThis",
                          "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                          ,0xf8,
                          "TiXmlNode *despot::util::tinyxml::TiXmlNode::InsertAfterChild(TiXmlNode *, const TiXmlNode &)"
                         );
          }
          ppTVar4 = &this->lastChild;
        }
        else {
          ppTVar4 = &pTVar1->prev;
        }
        *ppTVar4 = pTVar3;
        afterThis->next = pTVar3;
        return pTVar3;
      }
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::InsertAfterChild(TiXmlNode* afterThis,
	const TiXmlNode& addThis) {
	if (!afterThis || afterThis->parent != this) {
		return 0;
	}
	if (addThis.Type() == TiXmlNode::DOCUMENT) {
		if (GetDocument())
			GetDocument()->SetError(TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
		return 0;
	}

	TiXmlNode* node = addThis.Clone();
	if (!node)
		return 0;
	node->parent = this;

	node->prev = afterThis;
	node->next = afterThis->next;
	if (afterThis->next) {
		afterThis->next->prev = node;
	} else {
		assert(lastChild == afterThis);
		lastChild = node;
	}
	afterThis->next = node;
	return node;
}